

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall
CVmImageLoader::load_mres_link(CVmImageLoader *this,ulong siz,CVmImageLoaderMres *res_ifc)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  char buf_1 [1];
  char buf [16];
  char resname_buf [256];
  char fname_buf [256];
  byte local_259;
  CVmImageLoader *local_258;
  CVmImageLoaderMres *local_250;
  ushort local_248 [8];
  undefined1 local_238 [256];
  undefined1 local_138 [264];
  
  local_250 = res_ifc;
  if (1 < siz) {
    lVar1 = siz - 2;
    (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_248,2);
    uVar3 = (uint)local_248[0];
    if (local_248[0] != 0) {
      local_258 = this;
      do {
        if (lVar1 == 0) goto LAB_002962bd;
        uVar2 = lVar1 - 1;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_259,1);
        uVar4 = (ulong)local_259;
        if (uVar2 < uVar4) goto LAB_002962bd;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_238,uVar4);
        local_238[uVar4] = 0;
        if (uVar2 == uVar4) goto LAB_002962bd;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_259,1);
        uVar5 = (ulong)local_259;
        lVar1 = (uVar2 + ~uVar4) - uVar5;
        if (uVar2 + ~uVar4 < uVar5) goto LAB_002962bd;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,local_138,uVar5);
        this = local_258;
        local_138[uVar5] = 0;
        (*local_250->_vptr_CVmImageLoaderMres[3])(local_250,local_138,uVar5,local_238,uVar4);
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    if (lVar1 != 0) {
      (*this->fp_->_vptr_CVmImageFile[9])(this->fp_,lVar1);
    }
    return;
  }
LAB_002962bd:
  err_throw(0x132);
}

Assistant:

void CVmImageLoader::load_mres_link(ulong siz, CVmImageLoaderMres *res_ifc)
{
    char buf[16];
    uint entry_cnt;
    uint i;

    /* read the entry count and size of the table of contents */
    read_data(buf, 2, &siz);
    entry_cnt = osrp2(buf);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        char buf[1];
        uint resname_len, fname_len;
        char resname_buf[256], fname_buf[256];

        /* read the resource name */
        read_data(buf, 1, &siz);
        resname_len = (uchar)buf[0];
        read_data(resname_buf, resname_len, &siz);
        resname_buf[resname_len] = '\0';

        /* read the local filename this resource is linked to */
        read_data(buf, 1, &siz);
        fname_len = (uchar)buf[0];
        read_data(fname_buf, fname_len, &siz);
        fname_buf[fname_len] = '\0';

        /* add the resource to the resource interface */
        res_ifc->add_resource(fname_buf, fname_len, resname_buf, resname_len);
    }

    /* 
     *   skip the data portion of the block, since we now have a map of
     *   the data and can load individual resources on demand 
     */
    if (siz != 0)
        fp_->skip_ahead(siz);
}